

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.c
# Opt level: O1

_Bool check_parse_miniscript
                (char *function,char *descriptor,char *expected,char **key_name_list,
                char **key_value_list,size_t list_num,uint32_t flags)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *hex;
  size_t written;
  uchar script [520];
  
  written = 0;
  hex = (char *)0x0;
  uVar1 = wally_descriptor_parse_miniscript
                    (descriptor,(char **)0x0,(char **)0x0,0,0,(uint32_t)key_name_list,script,0x208,
                     &written);
  if (uVar1 == 0) {
    uVar1 = wally_hex_from_bytes(script,written,&hex);
    pcVar4 = hex;
    if (uVar1 == 0) {
      sVar3 = strlen(hex);
      iVar2 = strncmp(pcVar4,expected,sVar3 + 1);
      if (iVar2 != 0) {
        printf("%s:\n  Input: %s\n  Output: %s\n  Expect: %s\n",function,descriptor,pcVar4,expected)
        ;
      }
      wally_free_string(hex);
      return iVar2 == 0;
    }
    pcVar4 = "wally_hex_from_bytes NG[%d]\n";
  }
  else {
    pcVar4 = "wally_descriptor_parse_miniscript NG[%d]\n";
  }
  printf(pcVar4,(ulong)uVar1);
  return false;
}

Assistant:

static bool check_parse_miniscript(const char *function, const char *descriptor,
                                   const char *expected,
                                   const char **key_name_list,
                                   const char **key_value_list, size_t list_num,
                                   uint32_t flags)
{
    size_t written = 0;
    unsigned char script[520];
    char *hex = NULL;
    int ret;
    bool is_success = false;
    uint32_t index = 0;

    ret = wally_descriptor_parse_miniscript(
        descriptor,
        key_name_list,
        key_value_list,
        list_num,
        index,
        flags,
        script,
        sizeof(script),
        &written);
    if (ret != WALLY_OK) {
        printf("wally_descriptor_parse_miniscript NG[%d]\n", ret);
        return false;
    }

    ret = wally_hex_from_bytes(script, written, &hex);
    if (ret != WALLY_OK) {
        printf("wally_hex_from_bytes NG[%d]\n", ret);
        return false;
    }

    if (strncmp(hex, expected, strlen(hex) + 1) == 0) {
        is_success = true;
    } else
        printf("%s:\n  Input: %s\n  Output: %s\n  Expect: %s\n",
               function, descriptor, hex, expected);

    wally_free_string(hex);
    return is_success;
}